

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_gtk.cxx
# Opt level: O3

void gtk_down_box(int x,int y,int w,int h,Fl_Color c)

{
  gtk_down_frame(x,y,w,h,c);
  Fl::set_box_color(c);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
            (fl_graphics_driver,(ulong)(x + 3),(ulong)(y + 3U),(ulong)(w - 5),(ulong)(h - 4));
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
            (fl_graphics_driver,(ulong)((x + w) - 2),(ulong)(y + 3U),(ulong)(uint)(y + -3 + h));
  return;
}

Assistant:

static void gtk_down_box(int x, int y, int w, int h, Fl_Color c) {
  gtk_down_frame(x, y, w, h, c);

  gtk_color(c);
  fl_rectf(x + 3, y + 3, w - 5, h - 4);
  fl_yxline(x + w - 2, y + 3, y + h - 3);
}